

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_decoding.cc
# Opt level: O2

void __thiscall sptk::HuffmanDecoding::HuffmanDecoding(HuffmanDecoding *this,ifstream *input_stream)

{
  char cVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  Node *pNVar4;
  istream *piVar5;
  Node *pNVar6;
  size_type sVar7;
  int symbol;
  Node **local_60;
  ifstream *local_58;
  string bits;
  
  this->_vptr_HuffmanDecoding = (_func_int **)&PTR__HuffmanDecoding_0010fcd0;
  this->is_valid_ = true;
  this->root_ = (Node *)0x0;
  this->curr_node_ = (Node *)0x0;
  if (input_stream == (ifstream *)0x0) {
    this->is_valid_ = false;
  }
  else {
    local_58 = input_stream;
    pNVar4 = (Node *)operator_new(0x18);
    local_60 = &this->root_;
    *local_60 = pNVar4;
    pNVar4->left = (Node *)0x0;
    pNVar4->right = (Node *)0x0;
    bits._M_dataplus._M_p = (pointer)&bits.field_2;
    bits._M_string_length = 0;
    bits.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar5 = (istream *)std::istream::operator>>((istream *)local_58,&symbol);
      piVar5 = std::operator>>(piVar5,(string *)&bits);
      sVar3 = bits._M_string_length;
      _Var2 = bits._M_dataplus;
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
      pNVar4 = *local_60;
      for (sVar7 = 0; sVar3 != sVar7; sVar7 = sVar7 + 1) {
        cVar1 = _Var2._M_p[sVar7];
        pNVar6 = pNVar4;
        if (cVar1 == '1') {
          pNVar6 = (Node *)&pNVar4->right;
        }
        pNVar6 = pNVar6->left;
        if (pNVar6 == (Node *)0x0) {
          pNVar6 = (Node *)operator_new(0x18);
          pNVar6->left = (Node *)0x0;
          pNVar6->right = (Node *)0x0;
          if (cVar1 == '1') {
            pNVar4 = (Node *)&pNVar4->right;
          }
          pNVar4->left = pNVar6;
        }
        pNVar4 = pNVar6;
      }
      pNVar4->symbol = symbol;
    }
    std::__cxx11::string::~string((string *)&bits);
    this->curr_node_ = this->root_;
  }
  return;
}

Assistant:

HuffmanDecoding::HuffmanDecoding(std::ifstream* input_stream)
    : is_valid_(true), root_(NULL), curr_node_(NULL) {
  if (NULL == input_stream) {
    is_valid_ = false;
    return;
  }

  try {
    root_ = new Node;
    root_->left = NULL;
    root_->right = NULL;

    int symbol;
    std::string bits;
    while (*input_stream >> symbol >> bits) {
      Node* node(root_);
      for (const char& bit : bits) {
        const bool right('1' == bit ? true : false);
        Node* next_node(right ? node->right : node->left);
        if (NULL == next_node) {
          next_node = new Node;
          next_node->left = NULL;
          next_node->right = NULL;
          if (right) {
            node->right = next_node;
          } else {
            node->left = next_node;
          }
        }
        node = next_node;
      }
      node->symbol = symbol;
    }
  } catch (...) {
    Free(root_);
    is_valid_ = false;
    return;
  }

  curr_node_ = root_;
}